

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_filter.cpp
# Opt level: O1

string * __thiscall
duckdb::IsNullFilter::ToString
          (string *__return_storage_ptr__,IsNullFilter *this,string *column_name)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (column_name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + column_name->_M_string_length);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string IsNullFilter::ToString(const string &column_name) const {
	return column_name + " IS NULL";
}